

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::JunitReporter::writeGroup(JunitReporter *this,TestGroupNode *groupNode,double suiteTime)

{
  bool bVar1;
  int iVar2;
  IConfig *pIVar3;
  reference this_00;
  Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode> *testCaseNode;
  string local_2a8 [32];
  Catch local_288 [39];
  allocator local_261;
  string local_260 [32];
  undefined1 local_240 [40];
  Catch local_218 [39];
  allocator local_1f1;
  string local_1f0 [32];
  undefined1 local_1d0 [16];
  const_iterator itEnd;
  const_iterator it;
  string local_1b0 [39];
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [39];
  allocator local_139;
  string local_138 [32];
  size_t local_118;
  allocator local_109;
  string local_108 [32];
  unsigned_long local_e8;
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [32];
  TestGroupStats *local_68;
  TestGroupStats *stats;
  allocator local_49;
  string local_48 [32];
  undefined1 local_28 [8];
  ScopedElement e;
  double suiteTime_local;
  TestGroupNode *groupNode_local;
  JunitReporter *this_local;
  
  e.m_writer = (XmlWriter *)suiteTime;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"testsuite",&local_49);
  XmlWriter::scopedElement((XmlWriter *)local_28,(string *)&this->xml);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_68 = &groupNode->value;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"name",&local_89);
  XmlWriter::writeAttribute(&this->xml,(string *)local_88,&(local_68->groupInfo).name);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"errors",&local_b1);
  XmlWriter::writeAttribute<unsigned_int>(&this->xml,(string *)local_b0,&this->unexpectedExceptions)
  ;
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"failures",&local_d9);
  local_e8 = (local_68->totals).assertions.failed - (ulong)this->unexpectedExceptions;
  XmlWriter::writeAttribute<unsigned_long>(&this->xml,(string *)local_d8,&local_e8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"tests",&local_109);
  local_118 = Counts::total(&(local_68->totals).assertions);
  XmlWriter::writeAttribute<unsigned_long>(&this->xml,(string *)local_108,&local_118);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"hostname",&local_139);
  XmlWriter::writeAttribute<char[4]>(&this->xml,(string *)local_138,(char (*) [4])"tbd");
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  pIVar3 = Ptr<const_Catch::IConfig>::operator->(&(this->super_CumulativeReporterBase).m_config);
  iVar2 = (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])();
  if (iVar2 == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_160,"time",&local_161);
    XmlWriter::writeAttribute<char[1]>(&this->xml,(string *)local_160,(char (*) [1])0x1e1c08);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_188,"time",&local_189);
    XmlWriter::writeAttribute<double>(&this->xml,(string *)local_188,(double *)&e);
    std::__cxx11::string::~string(local_188);
    std::allocator<char>::~allocator((allocator<char> *)&local_189);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"timestamp",(allocator *)((long)&it._M_current + 7));
  XmlWriter::writeAttribute<char[4]>(&this->xml,(string *)local_1b0,(char (*) [4])"tbd");
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
  itEnd = std::
          vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
          ::begin(&groupNode->children);
  local_1d0._8_8_ =
       std::
       vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
       ::end(&groupNode->children);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&itEnd,(__normal_iterator<const_Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
                               *)(local_1d0 + 8));
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
              ::operator*(&itEnd);
    testCaseNode = Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
                   ::operator*(this_00);
    writeTestCase(this,testCaseNode);
    __gnu_cxx::
    __normal_iterator<const_Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
    ::operator++(&itEnd);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"system-out",&local_1f1);
  XmlWriter::scopedElement((XmlWriter *)local_1d0,(string *)&this->xml);
  std::__cxx11::ostringstream::str();
  trim(local_218,(string *)(local_240 + 8));
  XmlWriter::ScopedElement::writeText((ScopedElement *)local_1d0,(string *)local_218,false);
  std::__cxx11::string::~string((string *)local_218);
  std::__cxx11::string::~string((string *)(local_240 + 8));
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_1d0);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_260,"system-err",&local_261);
  XmlWriter::scopedElement((XmlWriter *)local_240,(string *)&this->xml);
  std::__cxx11::ostringstream::str();
  trim(local_288,local_2a8);
  XmlWriter::ScopedElement::writeText((ScopedElement *)local_240,(string *)local_288,false);
  std::__cxx11::string::~string((string *)local_288);
  std::__cxx11::string::~string((string *)local_2a8);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_240);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_28);
  return;
}

Assistant:

void writeGroup( TestGroupNode const& groupNode, double suiteTime ) {
            XmlWriter::ScopedElement e = xml.scopedElement( "testsuite" );
            TestGroupStats const& stats = groupNode.value;
            xml.writeAttribute( "name", stats.groupInfo.name );
            xml.writeAttribute( "errors", unexpectedExceptions );
            xml.writeAttribute( "failures", stats.totals.assertions.failed-unexpectedExceptions );
            xml.writeAttribute( "tests", stats.totals.assertions.total() );
            xml.writeAttribute( "hostname", "tbd" ); // !TBD
            if( m_config->showDurations() == ShowDurations::Never )
                xml.writeAttribute( "time", "" );
            else
                xml.writeAttribute( "time", suiteTime );
            xml.writeAttribute( "timestamp", "tbd" ); // !TBD

            // Write test cases
            for( TestGroupNode::ChildNodes::const_iterator
                    it = groupNode.children.begin(), itEnd = groupNode.children.end();
                    it != itEnd;
                    ++it )
                writeTestCase( **it );

            xml.scopedElement( "system-out" ).writeText( trim( stdOutForSuite.str() ), false );
            xml.scopedElement( "system-err" ).writeText( trim( stdErrForSuite.str() ), false );
        }